

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::ArrayComprehension::ArrayComprehension
          (ArrayComprehension *this,LocationRange *lr,Fodder *open_fodder,AST *body,
          Fodder *comma_fodder,bool trailing_comma,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs,Fodder *close_fodder)

{
  size_type sVar1;
  AST *in_RCX;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_RDI;
  LocationRange *in_R8;
  undefined1 in_R9B;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *unaff_retaddr;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *in_stack_00000008;
  Fodder *in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffd4;
  ASTType type;
  byte bVar2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *__x;
  
  type = CONCAT13(in_R9B,in_stack_ffffffffffffffd4) & 0x1ffffff;
  __x = in_RDI;
  AST::AST(in_RCX,in_R8,type,in_stack_ffffffffffffffc8);
  bVar2 = (byte)(type >> 0x18);
  (in_RDI->
  super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ArrayComprehension_003a5d90;
  in_RDI[5].
  super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RCX;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)unaff_retaddr,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  *(byte *)&in_RDI[6].
            super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = bVar2 & 1;
  std::
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  ::vector(unaff_retaddr,__x);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)unaff_retaddr,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  sVar1 = std::
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          ::size(in_stack_00000008);
  if (sVar1 != 0) {
    return;
  }
  __assert_fail("specs.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                0x10b,
                "jsonnet::internal::ArrayComprehension::ArrayComprehension(const LocationRange &, const Fodder &, AST *, const Fodder &, bool, const std::vector<ComprehensionSpec> &, const Fodder &)"
               );
}

Assistant:

ArrayComprehension(const LocationRange &lr, const Fodder &open_fodder, AST *body,
                       const Fodder &comma_fodder, bool trailing_comma,
                       const std::vector<ComprehensionSpec> &specs, const Fodder &close_fodder)
        : AST(lr, AST_ARRAY_COMPREHENSION, open_fodder),
          body(body),
          commaFodder(comma_fodder),
          trailingComma(trailing_comma),
          specs(specs),
          closeFodder(close_fodder)
    {
        assert(specs.size() > 0);
    }